

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_nls.c
# Opt level: O2

int cvNlsResidual(N_Vector ycor,N_Vector res,void *cvode_mem)

{
  int iVar1;
  
  if (cvode_mem == (void *)0x0) {
    iVar1 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,0x16f,"cvNlsResidual",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_nls.c"
                   ,"cvode_mem = NULL illegal.");
  }
  else {
    N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,*(undefined8 *)((long)cvode_mem + 0x60),ycor,
                 *(undefined8 *)((long)cvode_mem + 0xd0));
    iVar1 = (**(code **)((long)cvode_mem + 0x3e0))
                      (*(undefined8 *)((long)cvode_mem + 0x168),
                       *(undefined8 *)((long)cvode_mem + 0xd0),
                       *(undefined8 *)((long)cvode_mem + 0xe8),
                       *(undefined8 *)((long)cvode_mem + 0x18));
    *(long *)((long)cvode_mem + 0x360) = *(long *)((long)cvode_mem + 0x360) + 1;
    if (iVar1 < 0) {
      iVar1 = -8;
    }
    else if (iVar1 == 0) {
      N_VLinearSum(*(undefined8 *)((long)cvode_mem + 0x280),0x3ff0000000000000,
                   *(undefined8 *)((long)cvode_mem + 0x68),ycor,res);
      N_VLinearSum(*(ulong *)((long)cvode_mem + 0x288) ^ 0x8000000000000000,0x3ff0000000000000,
                   *(undefined8 *)((long)cvode_mem + 0xe8),res,res);
      iVar1 = 0;
    }
    else {
      iVar1 = 10;
    }
  }
  return iVar1;
}

Assistant:

static int cvNlsResidual(N_Vector ycor, N_Vector res, void* cvode_mem)
{
  CVodeMem cv_mem;
  int retval;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* update the state based on the current correction */
  N_VLinearSum(ONE, cv_mem->cv_zn[0], ONE, ycor, cv_mem->cv_y);

  /* evaluate the rhs function */
  retval = cv_mem->nls_f(cv_mem->cv_tn, cv_mem->cv_y, cv_mem->cv_ftemp,
                         cv_mem->cv_user_data);
  cv_mem->cv_nfe++;
  if (retval < 0) { return (CV_RHSFUNC_FAIL); }
  if (retval > 0) { return (RHSFUNC_RECVR); }

#ifdef SUNDIALS_BUILD_PACKAGE_FUSED_KERNELS
  if (cv_mem->cv_usefused)
  {
    cvNlsResid_fused(cv_mem->cv_rl1, -cv_mem->cv_gamma, cv_mem->cv_zn[1], ycor,
                     cv_mem->cv_ftemp, res);
  }
  else
#endif
  {
    N_VLinearSum(cv_mem->cv_rl1, cv_mem->cv_zn[1], ONE, ycor, res);
    N_VLinearSum(-cv_mem->cv_gamma, cv_mem->cv_ftemp, ONE, res, res);
  }

  return (CV_SUCCESS);
}